

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction_common.cpp
# Opt level: O0

void __thiscall cfd::UtxoData::UtxoData(UtxoData *this,UtxoData *object)

{
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  
  *in_RDI = 0;
  core::BlockHash::BlockHash((BlockHash *)0x508a16);
  core::Txid::Txid((Txid *)(in_RDI + 5));
  *(undefined4 *)(in_RDI + 9) = 0;
  core::Script::Script((Script *)(in_RDI + 10));
  core::Script::Script((Script *)(in_RDI + 0x11));
  core::Address::Address((Address *)(in_RDI + 0x18));
  std::__cxx11::string::string((string *)(in_RDI + 0x47));
  core::Amount::Amount((Amount *)(in_RDI + 0x4b));
  *(undefined4 *)(in_RDI + 0x4d) = 1;
  in_RDI[0x4e] = 0;
  core::ConfidentialAssetId::ConfidentialAssetId((ConfidentialAssetId *)(in_RDI + 0x4f));
  core::ElementsConfidentialAddress::ElementsConfidentialAddress
            ((ElementsConfidentialAddress *)(in_RDI + 0x54));
  core::BlindFactor::BlindFactor((BlindFactor *)(in_RDI + 0x8a));
  core::BlindFactor::BlindFactor((BlindFactor *)(in_RDI + 0x8e));
  core::ConfidentialValue::ConfidentialValue((ConfidentialValue *)(in_RDI + 0x92));
  core::Script::Script((Script *)(in_RDI + 0x97));
  *in_RDI = *in_RSI;
  core::BlockHash::operator=((BlockHash *)(in_RDI + 1),(BlockHash *)(in_RSI + 1));
  core::Txid::operator=((Txid *)(in_RDI + 5),(Txid *)(in_RSI + 5));
  *(undefined4 *)(in_RDI + 9) = *(undefined4 *)(in_RSI + 9);
  core::Script::operator=((Script *)(in_RDI + 10),(Script *)(in_RSI + 10));
  core::Script::operator=((Script *)(in_RDI + 0x11),(Script *)(in_RSI + 0x11));
  core::Address::operator=((Address *)(in_RDI + 0x18),(Address *)(in_RSI + 0x18));
  std::__cxx11::string::operator=((string *)(in_RDI + 0x47),(string *)(in_RSI + 0x47));
  *(undefined1 *)(in_RDI + 0x4c) = *(undefined1 *)(in_RSI + 0x4c);
  in_RDI[0x4b] = in_RSI[0x4b];
  *(undefined4 *)(in_RDI + 0x4d) = *(undefined4 *)(in_RSI + 0x4d);
  in_RDI[0x4e] = in_RSI[0x4e];
  core::ConfidentialAssetId::operator=
            ((ConfidentialAssetId *)(in_RDI + 0x4f),(ConfidentialAssetId *)(in_RSI + 0x4f));
  core::ElementsConfidentialAddress::operator=
            ((ElementsConfidentialAddress *)(in_RDI + 0x54),
             (ElementsConfidentialAddress *)(in_RSI + 0x54));
  core::BlindFactor::operator=((BlindFactor *)(in_RDI + 0x8a),(BlindFactor *)(in_RSI + 0x8a));
  core::BlindFactor::operator=((BlindFactor *)(in_RDI + 0x8e),(BlindFactor *)(in_RSI + 0x8e));
  core::ConfidentialValue::operator=
            ((ConfidentialValue *)(in_RDI + 0x92),(ConfidentialValue *)(in_RSI + 0x92));
  core::Script::operator=((Script *)(in_RDI + 0x97),(Script *)(in_RSI + 0x97));
  return;
}

Assistant:

UtxoData::UtxoData(const UtxoData& object) {
  block_height = object.block_height;
  block_hash = object.block_hash;
  txid = object.txid;
  vout = object.vout;
  locking_script = object.locking_script;
  redeem_script = object.redeem_script;
  address = object.address;
  descriptor = object.descriptor;
  amount = object.amount;
  address_type = object.address_type;
  binary_data = object.binary_data;
#ifndef CFD_DISABLE_ELEMENTS
  asset = object.asset;
  confidential_address = object.confidential_address;
  asset_blind_factor = object.asset_blind_factor;
  amount_blind_factor = object.amount_blind_factor;
  value_commitment = object.value_commitment;
#endif  // CFD_DISABLE_ELEMENTS
  scriptsig_template = object.scriptsig_template;
}